

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Test<signed_char,1,false,3u>
          (StorageMultisampleTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0xff0))(0xcf5,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd69);
  (**(code **)(lVar4 + 0xff0))(0xd05,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd6c);
  CreateInputTexture<signed_char,1,false,3u>(this);
  bVar1 = PrepareFramebufferMultisample<3u>(this,0x8231);
  if (bVar1) {
    PrepareFramebufferAuxiliary<3u>(this,0x8231);
    Draw<3u>(this);
    bVar1 = Check<signed_char,1,false,3u>(this);
    CleanAuxiliaryTexture(this);
    CleanFramebuffers(this);
    CleanInputTexture(this);
    CleanErrors(this);
  }
  else {
    CleanInputTexture(this);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StorageMultisampleTest::Test()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup. */
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	CreateInputTexture<T, S, N, D>();

	if (!PrepareFramebufferMultisample<D>(InternalFormat<T, S, N>()))
	{
		CleanInputTexture();

		return false;
	}

	PrepareFramebufferAuxiliary<D>(InternalFormat<T, S, N>());

	/* Action. */
	Draw<D>();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanAuxiliaryTexture();
	CleanFramebuffers();
	CleanInputTexture();
	CleanErrors();

	/* Pass result. */
	return result;
}